

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

void glfwSetCursorPos(GLFWwindow *handle,double xpos,double ypos)

{
  int iVar1;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/src/input.c"
                  ,699,"void glfwSetCursorPos(GLFWwindow *, double, double)");
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  if ((((xpos <= 1.79769313486232e+308) && (-1.79769313486232e+308 <= xpos)) &&
      (ypos <= 1.79769313486232e+308)) && (-1.79769313486232e+308 <= ypos)) {
    iVar1 = _glfwPlatformWindowFocused((_GLFWwindow *)handle);
    if (iVar1 != 0) {
      if (*(int *)(handle + 0x74) != 0x34003) {
        _glfwPlatformSetCursorPos((_GLFWwindow *)handle,xpos,ypos);
        return;
      }
      *(double *)(handle + 0x1e0) = xpos;
      *(double *)(handle + 0x1e8) = ypos;
    }
    return;
  }
  _glfwInputError(0x10004,"Invalid cursor position %f %f");
  return;
}

Assistant:

GLFWAPI void glfwSetCursorPos(GLFWwindow* handle, double xpos, double ypos)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (xpos != xpos || xpos < -DBL_MAX || xpos > DBL_MAX ||
        ypos != ypos || ypos < -DBL_MAX || ypos > DBL_MAX)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Invalid cursor position %f %f",
                        xpos, ypos);
        return;
    }

    if (!_glfwPlatformWindowFocused(window))
        return;

    if (window->cursorMode == GLFW_CURSOR_DISABLED)
    {
        // Only update the accumulated position if the cursor is disabled
        window->virtualCursorPosX = xpos;
        window->virtualCursorPosY = ypos;
    }
    else
    {
        // Update system cursor position
        _glfwPlatformSetCursorPos(window, xpos, ypos);
    }
}